

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase623::run(TestCase623 *this)

{
  TimerImpl *pTVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  __sighandler_t p_Var4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int *piVar5;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> local_168;
  Fault f;
  EventLoop loop;
  UnixEventPort port;
  
  captureSignals();
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  pTVar1 = &port.timerImpl;
  iVar2 = (**port.timerImpl.super_Timer._vptr_Timer)(pTVar1);
  (anonymous_namespace)::dummySignalHandlerCalled = '\0';
  p_Var4 = signal(0xe,dummySignalHandler);
  if (p_Var4 != (__sighandler_t)0xffffffffffffffff) {
    f.exception = (Exception *)0x0;
    setitimer(ITIMER_REAL,(itimerval *)&f,(itimerval *)0x0);
    (*port.timerImpl.super_Timer._vptr_Timer[2])(&local_168,pTVar1,100000000);
    Promise<void>::wait((Promise<void> *)&local_168,&waitScope);
    Own<kj::_::PromiseNode>::dispose(&local_168);
    if (((anonymous_namespace)::dummySignalHandlerCalled == '\0') && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x291,ERROR,"\"failed: expected \" \"dummySignalHandlerCalled\"",
                 (char (*) [42])"failed: expected dummySignalHandlerCalled");
    }
    iVar3 = (**port.timerImpl.super_Timer._vptr_Timer)(pTVar1);
    if ((CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) < 100000000) &&
       (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x292,ERROR,"\"failed: expected \" \"timer.now() - start >= timeout\"",
                 (char (*) [48])"failed: expected timer.now() - start >= timeout");
    }
    iVar3 = (**port.timerImpl.super_Timer._vptr_Timer)(pTVar1);
    if ((120000000 < CONCAT44(extraout_var_01,iVar3) - CONCAT44(extraout_var,iVar2)) &&
       (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[64]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x293,ERROR,
                 "\"failed: expected \" \"timer.now() - start <= timeout + (timeout / 5)\"",
                 (char (*) [64])"failed: expected timer.now() - start <= timeout + (timeout / 5)");
    }
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop(&loop);
    UnixEventPort::~UnixEventPort(&port);
    return;
  }
  piVar5 = __errno_location();
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
             ,0x288,*piVar5,"signal(SIGALRM)","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

TEST(AsyncUnixTest, InterruptedTimer) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

#if __linux__
  // Linux timeslices are 1ms.
  constexpr auto OS_SLOWNESS_FACTOR = 1;
#else
  // OSX timeslices are 10ms, so we need longer timeouts to avoid flakiness.
  // To be safe we'll assume other OS's are similar.
  constexpr auto OS_SLOWNESS_FACTOR = 10;
#endif

  // Schedule a timer event in 100ms.
  auto& timer = port.getTimer();
  auto start = timer.now();
  constexpr auto timeout = 100 * MILLISECONDS * OS_SLOWNESS_FACTOR;

  // Arrange SIGALRM to be delivered in 50ms, handled in an empty signal handler. This will cause
  // our wait to be interrupted with EINTR. We should nevertheless continue waiting for the right
  // amount of time.
  dummySignalHandlerCalled = false;
  if (signal(SIGALRM, &dummySignalHandler) == SIG_ERR) {
    KJ_FAIL_SYSCALL("signal(SIGALRM)", errno);
  }
  struct itimerval itv;
  memset(&itv, 0, sizeof(itv));
  itv.it_value.tv_usec = 50000 * OS_SLOWNESS_FACTOR;  // signal after 50ms
  setitimer(ITIMER_REAL, &itv, nullptr);

  timer.afterDelay(timeout).wait(waitScope);

  KJ_EXPECT(dummySignalHandlerCalled);
  KJ_EXPECT(timer.now() - start >= timeout);
  KJ_EXPECT(timer.now() - start <= timeout + (timeout / 5));  // allow 20ms error
}